

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

void __thiscall TestMustache::testFalsiness(TestMustache *this)

{
  bool bVar1;
  byte bVar2;
  QVariant *pQVar3;
  QString local_6e8;
  QVariant local_6d0;
  QtVariantContext local_6b0;
  QString local_688;
  QVariant local_670;
  QString local_650;
  QVariant local_638;
  QtVariantContext local_618;
  QString local_5f0;
  QVariant local_5d8;
  QString local_5b8;
  QVariant local_5a0;
  QtVariantContext local_580;
  QString local_558;
  QVariant local_540;
  QString local_520;
  QVariant local_508;
  QtVariantContext local_4e8;
  QString local_4c0;
  QVariant local_4a8;
  QString local_488;
  QVariant local_470;
  QtVariantContext local_450;
  QString local_428;
  QVariant local_410;
  QString local_3f0;
  QVariant local_3d8;
  QtVariantContext local_3b8;
  QString local_390;
  QVariant local_378;
  QString local_358;
  QVariant local_340;
  QtVariantContext local_320;
  QString local_2f8;
  QVariant local_2e0;
  QString local_2c0;
  QVariant local_2a8;
  QtVariantContext local_288;
  QString local_260;
  QVariant local_248;
  QString local_228;
  QVariant local_210;
  QtVariantContext local_1f0;
  QString local_1c8;
  QVariant local_1b0;
  undefined4 local_18c;
  undefined1 local_188 [8];
  QString output;
  undefined1 local_150 [8];
  QtVariantContext context;
  QVariant local_110;
  undefined1 local_e0 [8];
  QString _template;
  QVariantHash data;
  Renderer renderer;
  TestMustache *this_local;
  
  Mustache::Renderer::Renderer((Renderer *)&data);
  QHash<QString,_QVariant>::QHash((QHash<QString,_QVariant> *)&_template.d.size);
  QString::QString((QString *)local_e0,"{{#bool}}This should not be shown{{/bool}}");
  ::QVariant::QVariant(&local_110,0);
  QString::QString((QString *)&context.m_contextStack.super_QList<QVariant>.d.size,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,
                      (QString *)&context.m_contextStack.super_QList<QVariant>.d.size);
  ::QVariant::operator=(pQVar3,&local_110);
  QString::~QString((QString *)&context.m_contextStack.super_QList<QVariant>.d.size);
  ::QVariant::~QVariant(&local_110);
  ::QVariant::QVariant((QVariant *)&output.d.size,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext
            ((QtVariantContext *)local_150,(QVariant *)&output.d.size,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)&output.d.size);
  Mustache::Renderer::render
            ((QString *)local_188,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_1b0,0);
  QString::QString(&local_1c8,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_1c8);
  ::QVariant::operator=(pQVar3,&local_1b0);
  QString::~QString(&local_1c8);
  ::QVariant::~QVariant(&local_1b0);
  ::QVariant::QVariant(&local_210,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_1f0,&local_210,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_1f0);
  Mustache::QtVariantContext::~QtVariantContext(&local_1f0);
  ::QVariant::~QVariant(&local_210);
  Mustache::Renderer::render(&local_228,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_228);
  QString::~QString(&local_228);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","0u evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x92);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","0u evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x92);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_248,0);
  QString::QString(&local_260,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_260);
  ::QVariant::operator=(pQVar3,&local_248);
  QString::~QString(&local_260);
  ::QVariant::~QVariant(&local_248);
  ::QVariant::QVariant(&local_2a8,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_288,&local_2a8,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_288);
  Mustache::QtVariantContext::~QtVariantContext(&local_288);
  ::QVariant::~QVariant(&local_2a8);
  Mustache::Renderer::render(&local_2c0,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_2c0);
  QString::~QString(&local_2c0);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","0ll evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x98);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","0ll evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x98);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_2e0,0);
  QString::QString(&local_2f8,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_2f8);
  ::QVariant::operator=(pQVar3,&local_2e0);
  QString::~QString(&local_2f8);
  ::QVariant::~QVariant(&local_2e0);
  ::QVariant::QVariant(&local_340,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_320,&local_340,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_320);
  Mustache::QtVariantContext::~QtVariantContext(&local_320);
  ::QVariant::~QVariant(&local_340);
  Mustache::Renderer::render(&local_358,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_358);
  QString::~QString(&local_358);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","0ull evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x9e);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","0ull evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x9e);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_378,0.0);
  QString::QString(&local_390,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_390);
  ::QVariant::operator=(pQVar3,&local_378);
  QString::~QString(&local_390);
  ::QVariant::~QVariant(&local_378);
  ::QVariant::QVariant(&local_3d8,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_3b8,&local_3d8,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_3b8);
  Mustache::QtVariantContext::~QtVariantContext(&local_3b8);
  ::QVariant::~QVariant(&local_3d8);
  Mustache::Renderer::render(&local_3f0,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_3f0);
  QString::~QString(&local_3f0);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","0.0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xa4);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","0.0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xa4);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_410,0.4);
  QString::QString(&local_428,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_428);
  ::QVariant::operator=(pQVar3,&local_410);
  QString::~QString(&local_428);
  ::QVariant::~QVariant(&local_410);
  ::QVariant::QVariant(&local_470,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_450,&local_470,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_450);
  Mustache::QtVariantContext::~QtVariantContext(&local_450);
  ::QVariant::~QVariant(&local_470);
  Mustache::Renderer::render(&local_488,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_488);
  QString::~QString(&local_488);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(false,"!output.isEmpty()","0.4 evaluated as falsey",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xaa);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(true,"!output.isEmpty()","0.4 evaluated as falsey",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xaa);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_4a8,0.5);
  QString::QString(&local_4c0,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_4c0);
  ::QVariant::operator=(pQVar3,&local_4a8);
  QString::~QString(&local_4c0);
  ::QVariant::~QVariant(&local_4a8);
  ::QVariant::QVariant(&local_508,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_4e8,&local_508,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_4e8);
  Mustache::QtVariantContext::~QtVariantContext(&local_4e8);
  ::QVariant::~QVariant(&local_508);
  Mustache::Renderer::render(&local_520,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_520);
  QString::~QString(&local_520);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(false,"!output.isEmpty()","0.5f evaluated as falsey",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xb0);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(true,"!output.isEmpty()","0.5f evaluated as falsey",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xb0);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_540,0.0);
  QString::QString(&local_558,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_558);
  ::QVariant::operator=(pQVar3,&local_540);
  QString::~QString(&local_558);
  ::QVariant::~QVariant(&local_540);
  ::QVariant::QVariant(&local_5a0,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_580,&local_5a0,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_580);
  Mustache::QtVariantContext::~QtVariantContext(&local_580);
  ::QVariant::~QVariant(&local_5a0);
  Mustache::Renderer::render(&local_5b8,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_5b8);
  QString::~QString(&local_5b8);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","0.0f evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xb6);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","0.0f evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xb6);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_5d8,0);
  QString::QString(&local_5f0,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_5f0);
  ::QVariant::operator=(pQVar3,&local_5d8);
  QString::~QString(&local_5f0);
  ::QVariant::~QVariant(&local_5d8);
  ::QVariant::QVariant(&local_638,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_618,&local_638,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_618);
  Mustache::QtVariantContext::~QtVariantContext(&local_618);
  ::QVariant::~QVariant(&local_638);
  Mustache::Renderer::render(&local_650,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_650);
  QString::~QString(&local_650);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","\'",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xbc);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","\'",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xbc);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  ::QVariant::QVariant(&local_670,false);
  QString::QString(&local_688,"bool");
  pQVar3 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&_template.d.size,&local_688);
  ::QVariant::operator=(pQVar3,&local_670);
  QString::~QString(&local_688);
  ::QVariant::~QVariant(&local_670);
  ::QVariant::QVariant(&local_6d0,(QHash_conflict *)&_template.d.size);
  Mustache::QtVariantContext::QtVariantContext(&local_6b0,&local_6d0,(PartialResolver *)0x0);
  Mustache::QtVariantContext::operator=((QtVariantContext *)local_150,&local_6b0);
  Mustache::QtVariantContext::~QtVariantContext(&local_6b0);
  ::QVariant::~QVariant(&local_6d0);
  Mustache::Renderer::render(&local_6e8,(Renderer *)&data,(QString *)local_e0,(Context *)local_150);
  QString::operator=((QString *)local_188,&local_6e8);
  QString::~QString(&local_6e8);
  bVar1 = QString::isEmpty((QString *)local_188);
  if (bVar1) {
    bVar2 = QTest::qVerify(true,"output.isEmpty()","\'",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xc2);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  else {
    bVar2 = QTest::qVerify(false,"output.isEmpty()","\'",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0xc2);
    if ((bVar2 & 1) == 0) {
      local_18c = 1;
      goto LAB_00108cc1;
    }
  }
  local_18c = 0;
LAB_00108cc1:
  QString::~QString((QString *)local_188);
  Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)local_150);
  QString::~QString((QString *)local_e0);
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&_template.d.size);
  Mustache::Renderer::~Renderer((Renderer *)&data);
  return;
}

Assistant:

void TestMustache::testFalsiness()
{
	Mustache::Renderer renderer;
	QVariantHash data;
	QString _template = "{{#bool}}This should not be shown{{/bool}}";

	// test falsiness of 0
	data["bool"] = 0;
	Mustache::QtVariantContext context = Mustache::QtVariantContext(data);
	QString output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0 evaluated as truthy");

	// test falsiness of 0u
	data["bool"] = 0u;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0u evaluated as truthy");

	// test falsiness of 0ll
	data["bool"] = 0ll;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ll evaluated as truthy");

	// test falsiness of 0ull
	data["bool"] = 0ull;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ull evaluated as truthy");

	// test falsiness of 0.0
	data["bool"] = 0.0;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0 evaluated as truthy");

	// test falsiness of 0.4
	data["bool"] = 0.4f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.4 evaluated as falsey");

	// test falsiness of 0.5
	data["bool"] = 0.5f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.5f evaluated as falsey");

	// test falsiness of 0.0f
	data["bool"] = 0.0f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0f evaluated as truthy");

	// test falsiness of '\0'
	data["bool"] = '\0';
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");

	// test falsiness of 'false'
	data["bool"] = false;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");
}